

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     rox<(InstructionSet::M68k::Operation)99,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  FlagT FVar5;
  
  uVar3 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar3 + 2;
  iVar4 = uVar3 - (uVar3 / 0x21 << 5 | uVar3 / 0x21);
  if (iVar4 == 0) {
    FVar5 = status->extend_flag;
    lVar2 = 0x18;
  }
  else {
    bVar1 = (byte)iVar4;
    uVar3 = *destination;
    FVar5 = (FlagT)(1 << (bVar1 - 1 & 0x1f) & uVar3);
    status->carry_flag = FVar5;
    if (iVar4 == 1) {
      uVar3 = (uint)(status->extend_flag != 0) << 0x1f | uVar3 >> 1;
    }
    else if (iVar4 == 0x20) {
      uVar3 = (uint)(status->extend_flag != 0) + uVar3 * 2;
    }
    else {
      uVar3 = uVar3 << (0x21 - bVar1 & 0x1f) | uVar3 >> (bVar1 & 0x1f) |
              ((uint)(status->extend_flag != 0) << 0x1f) >> (bVar1 - 1 & 0x1f);
    }
    *destination = uVar3;
    lVar2 = 0x20;
  }
  *(FlagT *)((long)&status->trace_flag + lVar2) = FVar5;
  uVar3 = *destination;
  status->zero_result = (ulong)uVar3;
  status->negative_flag = (ulong)(uVar3 & 0x80000000);
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}